

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemFromBtree(BtCursor *pCur,u32 offset,u32 amt,Mem *pMem)

{
  int iVar1;
  
  pMem->flags = 1;
  if ((ulong)pCur->pBt->nPage * (ulong)pCur->pBt->pageSize < (ulong)(amt + offset)) {
    iVar1 = sqlite3CorruptError(0x13d2f);
    return iVar1;
  }
  iVar1 = sqlite3VdbeMemClearAndResize(pMem,amt + 1);
  if (iVar1 == 0) {
    iVar1 = sqlite3BtreePayload(pCur,offset,amt,pMem->z);
    if (iVar1 == 0) {
      pMem->z[amt] = '\0';
      pMem->flags = 0x10;
      pMem->n = amt;
      iVar1 = 0;
    }
    else {
      sqlite3VdbeMemRelease(pMem);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemFromBtree(
  BtCursor *pCur,   /* Cursor pointing at record to retrieve. */
  u32 offset,       /* Offset from the start of data to return bytes from. */
  u32 amt,          /* Number of bytes to return. */
  Mem *pMem         /* OUT: Return data in this Mem structure. */
){
  int rc;
  pMem->flags = MEM_Null;
  if( sqlite3BtreeMaxRecordSize(pCur)<offset+amt ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( SQLITE_OK==(rc = sqlite3VdbeMemClearAndResize(pMem, amt+1)) ){
    rc = sqlite3BtreePayload(pCur, offset, amt, pMem->z);
    if( rc==SQLITE_OK ){
      pMem->z[amt] = 0;   /* Overrun area used when reading malformed records */
      pMem->flags = MEM_Blob;
      pMem->n = (int)amt;
    }else{
      sqlite3VdbeMemRelease(pMem);
    }
  }
  return rc;
}